

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRewrite.c
# Opt level: O0

void Abc_ManRewritePrintDivs(Vec_Ptr_t *vDivs,int nLeaves)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  uint local_38;
  uint local_34;
  int k;
  int i;
  Abc_Obj_t *pRoot;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pFanin;
  int nLeaves_local;
  Vec_Ptr_t *vDivs_local;
  
  pAVar2 = (Abc_Obj_t *)Vec_PtrEntryLast(vDivs);
  local_34 = 0;
  do {
    iVar1 = Vec_PtrSize(vDivs);
    if (iVar1 <= (int)local_34) {
      printf("\n");
      return;
    }
    pObj = (Abc_Obj_t *)Vec_PtrEntry(vDivs,local_34);
    if ((int)local_34 < nLeaves) {
      printf("%6d : %c\n",(ulong)(uint)pObj->Id,(ulong)(local_34 + 0x61));
    }
    else {
      printf("%6d : %2d = ",(ulong)(uint)pObj->Id,(ulong)local_34);
      for (local_38 = 0; iVar1 = Vec_PtrSize(vDivs), (int)local_38 < iVar1; local_38 = local_38 + 1)
      {
        pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(vDivs,local_38);
        pAVar4 = Abc_ObjFanin0(pObj);
        if (pAVar4 == pAVar3) break;
      }
      if ((int)local_38 < nLeaves) {
        printf("%c",(ulong)(local_38 + 0x61));
      }
      else {
        printf("%d",(ulong)local_38);
      }
      iVar1 = Abc_ObjFaninC0(pObj);
      pcVar5 = "";
      if (iVar1 != 0) {
        pcVar5 = "\'";
      }
      printf("%s ",pcVar5);
      for (local_38 = 0; iVar1 = Vec_PtrSize(vDivs), (int)local_38 < iVar1; local_38 = local_38 + 1)
      {
        pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(vDivs,local_38);
        pAVar4 = Abc_ObjFanin1(pObj);
        if (pAVar4 == pAVar3) break;
      }
      if ((int)local_38 < nLeaves) {
        printf("%c",(ulong)(local_38 + 0x61));
      }
      else {
        printf("%d",(ulong)local_38);
      }
      iVar1 = Abc_ObjFaninC1(pObj);
      pcVar5 = "";
      if (iVar1 != 0) {
        pcVar5 = "\'";
      }
      printf("%s ",pcVar5);
      if (pObj == pAVar2) {
        printf(" root");
      }
      printf("\n");
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void Abc_ManRewritePrintDivs( Vec_Ptr_t * vDivs, int nLeaves )
{
    Abc_Obj_t * pFanin, * pNode, * pRoot;
    int i, k;
    pRoot = (Abc_Obj_t *)Vec_PtrEntryLast(vDivs);
    // print the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vDivs, pNode, i )
    {
        if ( i < nLeaves )
        {
            printf( "%6d : %c\n", pNode->Id, 'a'+i );
            continue;
        }
        printf( "%6d : %2d = ", pNode->Id, i );
        // find the first fanin
        Vec_PtrForEachEntry( Abc_Obj_t *, vDivs, pFanin, k )
            if ( Abc_ObjFanin0(pNode) == pFanin )
                break;
        if ( k < nLeaves )
            printf( "%c", 'a' + k );
        else
            printf( "%d", k );
        printf( "%s ", Abc_ObjFaninC0(pNode)? "\'" : "" );
        // find the second fanin
        Vec_PtrForEachEntry( Abc_Obj_t *, vDivs, pFanin, k )
            if ( Abc_ObjFanin1(pNode) == pFanin )
                break;
        if ( k < nLeaves )
            printf( "%c", 'a' + k );
        else
            printf( "%d", k );
        printf( "%s ", Abc_ObjFaninC1(pNode)? "\'" : "" );
        if ( pNode == pRoot )
            printf( " root" );
        printf( "\n" );
    }
    printf( "\n" );
}